

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

bool __thiscall
cmSourceFileLocation::MatchesAmbiguousExtension
          (cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  string *__lhs;
  ulong N;
  char *str1;
  __type _Var1;
  bool bVar2;
  bool bVar3;
  cmake *this_00;
  string sStack_48;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmSourceFileLocation.cxx"
                  ,0x8a,
                  "bool cmSourceFileLocation::MatchesAmbiguousExtension(const cmSourceFileLocation &) const"
                 );
  }
  __lhs = &this->Name;
  _Var1 = std::operator==(__lhs,&loc->Name);
  bVar2 = true;
  if (!_Var1) {
    N = (loc->Name)._M_string_length;
    if (((N < (this->Name)._M_string_length) && (str1 = (__lhs->_M_dataplus)._M_p, str1[N] == '.'))
       && (bVar2 = cmHasLiteralPrefixImpl(str1,(loc->Name)._M_dataplus._M_p,N), bVar2)) {
      std::__cxx11::string::substr((ulong)&sStack_48,(ulong)__lhs);
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      bVar2 = cmake::IsSourceExtension(this_00,&sStack_48);
      bVar3 = true;
      if (!bVar2) {
        bVar3 = cmake::IsHeaderExtension(this_00,&sStack_48);
      }
      std::__cxx11::string::~string((string *)&sStack_48);
      return bVar3;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmSourceFileLocation::MatchesAmbiguousExtension(
  cmSourceFileLocation const& loc) const
{
  assert(this->Makefile);
  // This location's extension is not ambiguous but loc's extension
  // is.  See if the names match as-is.
  if (this->Name == loc.Name) {
    return true;
  }

  // Check if loc's name could possibly be extended to our name by
  // adding an extension.
  if (!(this->Name.size() > loc.Name.size() &&
        this->Name[loc.Name.size()] == '.' &&
        cmHasLiteralPrefixImpl(this->Name.c_str(), loc.Name.c_str(),
                               loc.Name.size()))) {
    return false;
  }

  // Only a fixed set of extensions will be tried to match a file on
  // disk.  One of these must match if loc refers to this source file.
  std::string const& ext = this->Name.substr(loc.Name.size() + 1);
  cmMakefile const* mf = this->Makefile;
  auto cm = mf->GetCMakeInstance();
  return cm->IsSourceExtension(ext) || cm->IsHeaderExtension(ext);
}